

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::ret_c(CPU *this)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined2 in_DX;
  CPU *this_local;
  
  if ((this->regs->f & 0x10) == 0) {
    this_local._4_4_ = 2;
  }
  else {
    uVar1 = this->regs->sp;
    iVar2 = (*this->mmu->_vptr_IMmu[1])
                      (this->mmu,(ulong)uVar1,in_DX,CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar1));
    this->regs->pc = (uint16_t)iVar2;
    this->regs->sp = this->regs->sp + 2;
    this_local._4_4_ = 5;
  }
  return this_local._4_4_;
}

Assistant:

int CPU::ret_c() {
    if (regs.f & 0x10) {
        regs.pc = mmu.read_word(regs.sp);
        regs.sp += 2;
        return 5;
    } else {
        return 2;
    }
}